

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlaneSurface::Read(ON_ClippingPlaneSurface *this,ON_BinaryArchive *file)

{
  bool bVar1;
  ON__INT64 local_38;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  int iStack_24;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_ClippingPlaneSurface *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  Default(this);
  iStack_24 = 0;
  tcode = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk
                    (_minor_version,0x40008000,&stack0xffffffffffffffdc,(int *)&tcode);
  if (bVar1) {
    big_value._7_1_ = iStack_24 == 1;
    if ((bool)big_value._7_1_) {
      big_value._0_4_ = 0;
      local_38 = 0;
      bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(_minor_version,(uint *)&big_value,&local_38);
      big_value._7_1_ = -bVar1 & 1;
      if (big_value._7_1_ != 0) {
        big_value._7_1_ = (int)big_value == 0x40008000;
        if ((bool)big_value._7_1_) {
          bVar1 = ON_PlaneSurface::Read(&this->super_ON_PlaneSurface,_minor_version);
          big_value._7_1_ = -bVar1 & 1;
        }
        bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
        if (!bVar1) {
          big_value._7_1_ = 0;
        }
      }
      if ((big_value._7_1_ & 1) != 0) {
        big_value._7_1_ = ON_ClippingPlane::Read(&this->m_clipping_plane,_minor_version);
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(_minor_version);
    if (!bVar1) {
      big_value._7_1_ = 0;
    }
    this_local._7_1_ = (bool)(big_value._7_1_ & 1);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ClippingPlaneSurface::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;

  bool rc = file.BeginRead3dmChunk(TCODE_ANONYMOUS_CHUNK,&major_version,&minor_version);
  if (!rc)
    return false;

  for(;;)
  {
    rc =  ( 1 == major_version );
    if (!rc) break;

    ON__UINT32 tcode = 0;
    ON__INT64 big_value = 0;

    rc = file.BeginRead3dmBigChunk(&tcode,&big_value)?true:false;
    if (rc)
    {
      rc = (TCODE_ANONYMOUS_CHUNK == tcode);
      if (rc)
        rc = (ON_PlaneSurface::Read(file)?true:false);
      if (!file.EndRead3dmChunk())
        rc = false;
    }
    if (!rc) break;

    rc = m_clipping_plane.Read(file);
    if (rc) break;

    break;
  }

  if (!file.EndRead3dmChunk() )
    rc = false;

  return rc;
}